

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::InstanceArrayIntersector1>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  ulong uVar13;
  undefined8 uVar14;
  byte bVar15;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar16;
  long lVar17;
  byte bVar18;
  byte bVar19;
  ulong uVar20;
  ulong uVar21;
  size_t sVar22;
  Primitive *prim;
  ulong uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  float fVar34;
  float fVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined4 uVar38;
  undefined8 uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  long lStack_2490;
  StackItemT<embree::NodeRefPtr<8>_> *local_2488;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return;
  }
  local_2488 = stack + 1;
  stack[0].dist = 0;
  aVar1 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar7 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
  auVar8 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
  auVar25._8_4_ = 0x7fffffff;
  auVar25._0_8_ = 0x7fffffff7fffffff;
  auVar25._12_4_ = 0x7fffffff;
  auVar25 = vandps_avx512vl((undefined1  [16])aVar1,auVar25);
  auVar40._8_4_ = 0x219392ef;
  auVar40._0_8_ = 0x219392ef219392ef;
  auVar40._12_4_ = 0x219392ef;
  uVar20 = vcmpps_avx512vl(auVar25,auVar40,1);
  bVar24 = (bool)((byte)uVar20 & 1);
  auVar26._0_4_ = (uint)bVar24 * 0x219392ef | (uint)!bVar24 * (int)aVar1.x;
  bVar24 = (bool)((byte)(uVar20 >> 1) & 1);
  auVar26._4_4_ = (uint)bVar24 * 0x219392ef | (uint)!bVar24 * (int)aVar1.y;
  bVar24 = (bool)((byte)(uVar20 >> 2) & 1);
  auVar26._8_4_ = (uint)bVar24 * 0x219392ef | (uint)!bVar24 * (int)aVar1.z;
  bVar24 = (bool)((byte)(uVar20 >> 3) & 1);
  auVar26._12_4_ = (uint)bVar24 * 0x219392ef | (uint)!bVar24 * aVar1.field_3.a;
  auVar25 = vrcp14ps_avx512vl(auVar26);
  auVar27._8_4_ = 0x3f800000;
  auVar27._0_8_ = 0x3f8000003f800000;
  auVar27._12_4_ = 0x3f800000;
  auVar27 = vfnmadd213ps_avx512vl(auVar26,auVar25,auVar27);
  auVar26 = vfmadd132ps_fma(auVar27,auVar25,auVar25);
  fVar34 = auVar26._0_4_;
  auVar25 = vmovshdup_avx(auVar26);
  uVar39 = auVar25._0_8_;
  auVar27 = vshufpd_avx(auVar26,auVar26,1);
  auVar41._8_4_ = 2;
  auVar41._0_8_ = 0x200000002;
  auVar41._12_4_ = 2;
  auVar41._16_4_ = 2;
  auVar41._20_4_ = 2;
  auVar41._24_4_ = 2;
  auVar41._28_4_ = 2;
  auVar12 = vpermps_avx2(auVar41,ZEXT1632(auVar26));
  fVar35 = fVar34 * (ray->super_RayK<1>).org.field_0.m128[0];
  auVar43._8_4_ = 1;
  auVar43._0_8_ = 0x100000001;
  auVar43._12_4_ = 1;
  auVar43._16_4_ = 1;
  auVar43._20_4_ = 1;
  auVar43._24_4_ = 1;
  auVar43._28_4_ = 1;
  auVar36 = ZEXT1632(CONCAT412(auVar26._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                               CONCAT48(auVar26._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                        CONCAT44(auVar26._4_4_ *
                                                 (ray->super_RayK<1>).org.field_0.m128[1],fVar35))))
  ;
  auVar43 = vpermps_avx2(auVar43,auVar36);
  auVar36 = vpermps_avx2(auVar41,auVar36);
  uVar21 = (ulong)(fVar34 < 0.0) * 0x20;
  uVar23 = (ulong)(auVar25._0_4_ < 0.0) << 5 | 0x40;
  uVar20 = (ulong)(auVar27._0_4_ < 0.0) << 5 | 0x80;
  uVar38 = auVar8._0_4_;
  auVar37._4_4_ = uVar38;
  auVar37._0_4_ = uVar38;
  auVar37._8_4_ = uVar38;
  auVar37._12_4_ = uVar38;
  auVar37._16_4_ = uVar38;
  auVar37._20_4_ = uVar38;
  auVar37._24_4_ = uVar38;
  auVar37._28_4_ = uVar38;
  auVar45._0_8_ = CONCAT44(fVar35,fVar35) ^ 0x8000000080000000;
  auVar45._8_4_ = -fVar35;
  auVar45._12_4_ = -fVar35;
  auVar45._16_4_ = -fVar35;
  auVar45._20_4_ = -fVar35;
  auVar45._24_4_ = -fVar35;
  auVar45._28_4_ = -fVar35;
  auVar46._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
  auVar46._8_4_ = auVar43._8_4_ ^ 0x80000000;
  auVar46._12_4_ = auVar43._12_4_ ^ 0x80000000;
  auVar46._16_4_ = auVar43._16_4_ ^ 0x80000000;
  auVar46._20_4_ = auVar43._20_4_ ^ 0x80000000;
  auVar46._24_4_ = auVar43._24_4_ ^ 0x80000000;
  auVar46._28_4_ = auVar43._28_4_ ^ 0x80000000;
  auVar47._0_8_ = auVar36._0_8_ ^ 0x8000000080000000;
  auVar47._8_4_ = auVar36._8_4_ ^ 0x80000000;
  auVar47._12_4_ = auVar36._12_4_ ^ 0x80000000;
  auVar47._16_4_ = auVar36._16_4_ ^ 0x80000000;
  auVar47._20_4_ = auVar36._20_4_ ^ 0x80000000;
  auVar47._24_4_ = auVar36._24_4_ ^ 0x80000000;
  auVar47._28_4_ = auVar36._28_4_ ^ 0x80000000;
  uVar38 = auVar7._0_4_;
  auVar36._4_4_ = uVar38;
  auVar36._0_4_ = uVar38;
  auVar36._8_4_ = uVar38;
  auVar36._12_4_ = uVar38;
  auVar36._16_4_ = uVar38;
  auVar36._20_4_ = uVar38;
  auVar36._24_4_ = uVar38;
  auVar36._28_4_ = uVar38;
  auVar43 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  do {
    auVar48._8_4_ = 0xfffffff8;
    auVar48._0_8_ = 0xfffffff8fffffff8;
    auVar48._12_4_ = 0xfffffff8;
    auVar48._16_4_ = 0xfffffff8;
    auVar48._20_4_ = 0xfffffff8;
    auVar48._24_4_ = 0xfffffff8;
    auVar48._28_4_ = 0xfffffff8;
    auVar42 = ZEXT3264(CONCAT428(fVar34,CONCAT424(fVar34,CONCAT420(fVar34,CONCAT416(fVar34,CONCAT412
                                                  (fVar34,CONCAT48(fVar34,CONCAT44(fVar34,fVar34))))
                                                  ))));
    auVar44 = ZEXT3264(CONCAT824(uVar39,CONCAT816(uVar39,CONCAT88(uVar39,uVar39))));
LAB_01c7e703:
    do {
      if (local_2488 == stack) {
        return;
      }
      pSVar16 = local_2488 + -1;
      local_2488 = local_2488 + -1;
    } while ((ray->super_RayK<1>).tfar < (float)pSVar16->dist);
    sVar22 = (local_2488->ptr).ptr;
LAB_01c7e730:
    if ((sVar22 & 8) == 0) {
      auVar7 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar22 + 0x40 + uVar21),auVar45,auVar42._0_32_
                              );
      auVar8 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar22 + 0x40 + uVar23),auVar46,auVar44._0_32_
                              );
      auVar41 = vpmaxsd_avx2(ZEXT1632(auVar7),ZEXT1632(auVar8));
      auVar7 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar22 + 0x40 + uVar20),auVar47,auVar12);
      auVar31 = vpmaxsd_avx2(ZEXT1632(auVar7),auVar36);
      auVar41 = vpmaxsd_avx2(auVar41,auVar31);
      auVar7 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar22 + 0x40 + (uVar21 ^ 0x20)),auVar45,
                               auVar42._0_32_);
      auVar8 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar22 + 0x40 + (uVar23 ^ 0x20)),auVar46,
                               auVar44._0_32_);
      auVar31 = vpminsd_avx2(ZEXT1632(auVar7),ZEXT1632(auVar8));
      auVar7 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar22 + 0x40 + (uVar20 ^ 0x20)),auVar47,
                               auVar12);
      auVar9 = vpminsd_avx2(ZEXT1632(auVar7),auVar37);
      auVar31 = vpminsd_avx2(auVar31,auVar9);
      uVar13 = vpcmpd_avx512vl(auVar41,auVar31,2);
      bVar19 = (byte)uVar13;
      if (bVar19 == 0) goto LAB_01c7e703;
      auVar31 = *(undefined1 (*) [32])(sVar22 & 0xfffffffffffffff0);
      auVar9 = ((undefined1 (*) [32])(sVar22 & 0xfffffffffffffff0))[1];
      auVar28 = vpternlogd_avx512vl(auVar43,auVar41,auVar48,0xf8);
      auVar29 = vpcompressd_avx512vl(auVar28);
      auVar30._0_4_ = (uint)(bVar19 & 1) * auVar29._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar28._0_4_
      ;
      bVar24 = (bool)((byte)(uVar13 >> 1) & 1);
      auVar30._4_4_ = (uint)bVar24 * auVar29._4_4_ | (uint)!bVar24 * auVar28._4_4_;
      bVar24 = (bool)((byte)(uVar13 >> 2) & 1);
      auVar30._8_4_ = (uint)bVar24 * auVar29._8_4_ | (uint)!bVar24 * auVar28._8_4_;
      bVar24 = (bool)((byte)(uVar13 >> 3) & 1);
      auVar30._12_4_ = (uint)bVar24 * auVar29._12_4_ | (uint)!bVar24 * auVar28._12_4_;
      bVar24 = (bool)((byte)(uVar13 >> 4) & 1);
      auVar30._16_4_ = (uint)bVar24 * auVar29._16_4_ | (uint)!bVar24 * auVar28._16_4_;
      bVar24 = (bool)((byte)(uVar13 >> 5) & 1);
      auVar30._20_4_ = (uint)bVar24 * auVar29._20_4_ | (uint)!bVar24 * auVar28._20_4_;
      bVar24 = (bool)((byte)(uVar13 >> 6) & 1);
      auVar30._24_4_ = (uint)bVar24 * auVar29._24_4_ | (uint)!bVar24 * auVar28._24_4_;
      bVar24 = SUB81(uVar13 >> 7,0);
      auVar30._28_4_ = (uint)bVar24 * auVar29._28_4_ | (uint)!bVar24 * auVar28._28_4_;
      auVar28 = vpermt2q_avx512vl(auVar31,auVar30,auVar9);
      sVar22 = auVar28._0_8_;
      bVar19 = bVar19 - 1 & bVar19;
      if (bVar19 != 0) {
        auVar28 = vpshufd_avx2(auVar30,0x55);
        vpermt2q_avx512vl(auVar31,auVar28,auVar9);
        auVar29 = vpminsd_avx2(auVar30,auVar28);
        auVar28 = vpmaxsd_avx2(auVar30,auVar28);
        bVar19 = bVar19 - 1 & bVar19;
        if (bVar19 == 0) {
          auVar30 = vpermi2q_avx512vl(auVar29,auVar31,auVar9);
          sVar22 = auVar30._0_8_;
          auVar31 = vpermt2q_avx512vl(auVar31,auVar28,auVar9);
          (local_2488->ptr).ptr = auVar31._0_8_;
          lVar17 = 8;
          lStack_2490 = 0x10;
        }
        else {
          auVar11 = vpshufd_avx2(auVar30,0xaa);
          vpermt2q_avx512vl(auVar31,auVar11,auVar9);
          auVar33 = vpminsd_avx2(auVar29,auVar11);
          auVar29 = vpmaxsd_avx2(auVar29,auVar11);
          auVar11 = vpminsd_avx2(auVar28,auVar29);
          auVar29 = vpmaxsd_avx2(auVar28,auVar29);
          bVar19 = bVar19 - 1 & bVar19;
          if (bVar19 == 0) {
            auVar28 = vpermi2q_avx512vl(auVar33,auVar31,auVar9);
            sVar22 = auVar28._0_8_;
            auVar28 = vpermt2q_avx512vl(auVar31,auVar29,auVar9);
            (local_2488->ptr).ptr = auVar28._0_8_;
            auVar28 = vpermd_avx2(auVar29,auVar41);
            local_2488->dist = auVar28._0_4_;
            auVar31 = vpermt2q_avx512vl(auVar31,auVar11,auVar9);
            local_2488[1].ptr.ptr = auVar31._0_8_;
            lVar17 = 0x18;
            lStack_2490 = 0x20;
            auVar28 = auVar11;
          }
          else {
            auVar28 = vpshufd_avx2(auVar30,0xff);
            vpermt2q_avx512vl(auVar31,auVar28,auVar9);
            auVar10 = vpminsd_avx2(auVar33,auVar28);
            auVar33 = vpmaxsd_avx2(auVar33,auVar28);
            auVar28 = vpminsd_avx2(auVar11,auVar33);
            auVar33 = vpmaxsd_avx2(auVar11,auVar33);
            auVar11 = vpminsd_avx2(auVar29,auVar33);
            auVar29 = vpmaxsd_avx2(auVar29,auVar33);
            bVar19 = bVar19 - 1 & bVar19;
            if (bVar19 != 0) {
              auVar32 = valignd_avx512vl(auVar30,auVar30,3);
              auVar30 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
              auVar33 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                             CONCAT48(0x80000000,0x8000000080000000)
                                                            )),auVar30,auVar10);
              auVar30 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
              auVar28 = vpermt2d_avx512vl(auVar33,auVar30,auVar28);
              auVar30 = vpermt2d_avx512vl(auVar28,auVar30,auVar11);
              auVar28 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
              auVar28 = vpermt2d_avx512vl(auVar30,auVar28,auVar29);
              auVar42 = ZEXT3264(auVar28);
              bVar18 = bVar19;
              do {
                auVar30 = auVar42._0_32_;
                auVar28._8_4_ = 1;
                auVar28._0_8_ = 0x100000001;
                auVar28._12_4_ = 1;
                auVar28._16_4_ = 1;
                auVar28._20_4_ = 1;
                auVar28._24_4_ = 1;
                auVar28._28_4_ = 1;
                auVar28 = vpermd_avx2(auVar28,auVar32);
                auVar32 = valignd_avx512vl(auVar32,auVar32,1);
                vpermt2q_avx512vl(auVar31,auVar32,auVar9);
                bVar18 = bVar18 - 1 & bVar18;
                uVar14 = vpcmpd_avx512vl(auVar28,auVar30,5);
                auVar28 = vpmaxsd_avx2(auVar28,auVar30);
                bVar15 = (byte)uVar14 << 1;
                auVar30 = valignd_avx512vl(auVar30,auVar30,7);
                bVar24 = (bool)((byte)uVar14 & 1);
                bVar2 = (bool)(bVar15 >> 2 & 1);
                bVar3 = (bool)(bVar15 >> 3 & 1);
                bVar4 = (bool)(bVar15 >> 4 & 1);
                bVar5 = (bool)(bVar15 >> 5 & 1);
                bVar6 = (bool)(bVar15 >> 6 & 1);
                auVar42 = ZEXT3264(CONCAT428((uint)(bVar15 >> 7) * auVar30._28_4_ |
                                             (uint)!(bool)(bVar15 >> 7) * auVar28._28_4_,
                                             CONCAT424((uint)bVar6 * auVar30._24_4_ |
                                                       (uint)!bVar6 * auVar28._24_4_,
                                                       CONCAT420((uint)bVar5 * auVar30._20_4_ |
                                                                 (uint)!bVar5 * auVar28._20_4_,
                                                                 CONCAT416((uint)bVar4 *
                                                                           auVar30._16_4_ |
                                                                           (uint)!bVar4 *
                                                                           auVar28._16_4_,
                                                                           CONCAT412((uint)bVar3 *
                                                                                     auVar30._12_4_
                                                                                     | (uint)!bVar3
                                                                                       * auVar28.
                                                  _12_4_,CONCAT48((uint)bVar2 * auVar30._8_4_ |
                                                                  (uint)!bVar2 * auVar28._8_4_,
                                                                  CONCAT44((uint)bVar24 *
                                                                           auVar30._4_4_ |
                                                                           (uint)!bVar24 *
                                                                           auVar28._4_4_,
                                                                           auVar28._0_4_))))))));
              } while (bVar18 != 0);
              lVar17 = (ulong)(uint)POPCOUNT((uint)bVar19) + 3;
              while( true ) {
                auVar30 = auVar42._0_32_;
                auVar28 = vpermt2q_avx512vl(auVar31,auVar30,auVar9);
                sVar22 = auVar28._0_8_;
                bVar24 = lVar17 == 0;
                lVar17 = lVar17 + -1;
                if (bVar24) break;
                (local_2488->ptr).ptr = sVar22;
                auVar28 = vpermd_avx2(auVar30,auVar41);
                local_2488->dist = auVar28._0_4_;
                auVar28 = valignd_avx512vl(auVar30,auVar30,1);
                auVar42 = ZEXT3264(auVar28);
                local_2488 = local_2488 + 1;
              }
              auVar42 = ZEXT3264(CONCAT428(fVar34,CONCAT424(fVar34,CONCAT420(fVar34,CONCAT416(fVar34
                                                  ,CONCAT412(fVar34,CONCAT48(fVar34,CONCAT44(fVar34,
                                                  fVar34))))))));
              auVar44 = ZEXT3264(CONCAT824(uVar39,CONCAT816(uVar39,CONCAT88(uVar39,uVar39))));
              goto LAB_01c7e730;
            }
            auVar30 = vpermi2q_avx512vl(auVar10,auVar31,auVar9);
            sVar22 = auVar30._0_8_;
            auVar30 = vpermt2q_avx512vl(auVar31,auVar29,auVar9);
            (local_2488->ptr).ptr = auVar30._0_8_;
            auVar30 = vpermd_avx2(auVar29,auVar41);
            local_2488->dist = auVar30._0_4_;
            auVar30 = vpermt2q_avx512vl(auVar31,auVar11,auVar9);
            local_2488[1].ptr.ptr = auVar30._0_8_;
            auVar30 = vpermd_avx2(auVar11,auVar41);
            local_2488[1].dist = auVar30._0_4_;
            auVar31 = vpermt2q_avx512vl(auVar31,auVar28,auVar9);
            local_2488[2].ptr.ptr = auVar31._0_8_;
            lStack_2490 = 0x28;
            lVar17 = lStack_2490;
            lStack_2490 = 0x30;
          }
          auVar42 = ZEXT3264(CONCAT428(fVar34,CONCAT424(fVar34,CONCAT420(fVar34,CONCAT416(fVar34,
                                                  CONCAT412(fVar34,CONCAT48(fVar34,CONCAT44(fVar34,
                                                  fVar34))))))));
          auVar44 = ZEXT3264(CONCAT824(uVar39,CONCAT816(uVar39,CONCAT88(uVar39,uVar39))));
        }
        auVar41 = vpermd_avx2(auVar28,auVar41);
        *(int *)((long)&(local_2488->ptr).ptr + lVar17) = auVar41._0_4_;
        local_2488 = (StackItemT<embree::NodeRefPtr<8>_> *)
                     ((long)&(local_2488->ptr).ptr + lStack_2490);
      }
      goto LAB_01c7e730;
    }
    lVar17 = (ulong)((uint)sVar22 & 0xf) - 8;
    prim = (Primitive *)(sVar22 & 0xfffffffffffffff0);
    while (bVar24 = lVar17 != 0, lVar17 = lVar17 + -1, bVar24) {
      InstanceArrayIntersector1::intersect(&pre,ray,context,prim);
      prim = prim + 1;
    }
    fVar35 = (ray->super_RayK<1>).tfar;
    auVar37._4_4_ = fVar35;
    auVar37._0_4_ = fVar35;
    auVar37._8_4_ = fVar35;
    auVar37._12_4_ = fVar35;
    auVar37._16_4_ = fVar35;
    auVar37._20_4_ = fVar35;
    auVar37._24_4_ = fVar35;
    auVar37._28_4_ = fVar35;
    auVar43 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  } while( true );
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }